

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

string * __thiscall
xla::GraphCycles::DebugString_abi_cxx11_(string *__return_storage_ptr__,GraphCycles *this)

{
  int iVar1;
  uint uVar2;
  _Hash_node_base *p_Var3;
  pointer pNVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint *puVar14;
  uint __len;
  uint uVar15;
  string __str_1;
  string __str;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> free_nodes_set;
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  string *local_d8;
  ulong local_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8 [2];
  long local_98 [2];
  GraphCycles *local_88;
  ulong local_80;
  uint *local_78;
  uint *local_70;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  std::
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_68,
             (this->rep_->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->rep_->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,0,&local_c8,&local_138,&local_f8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"digraph {\n","")
  ;
  local_80 = (long)(this->rep_->nodes_).
                   super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->rep_->nodes_).
                   super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_88 = this;
  if ((long)local_80 < 1) {
LAB_001997af:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
    return __return_storage_ptr__;
  }
  uVar12 = 0;
  local_d8 = __return_storage_ptr__;
LAB_00199318:
  uVar13 = (ulong)(long)(int)uVar12 % local_68._M_bucket_count;
  if (local_68._M_buckets[uVar13] != (__node_base_ptr)0x0) {
    p_Var3 = local_68._M_buckets[uVar13]->_M_nxt;
    iVar1 = *(int *)&p_Var3[1]._M_nxt;
    while (iVar1 != (int)uVar12) {
      p_Var3 = p_Var3->_M_nxt;
      if ((p_Var3 == (_Hash_node_base *)0x0) ||
         (iVar1 = *(int *)&p_Var3[1]._M_nxt, (ulong)(long)iVar1 % local_68._M_bucket_count != uVar13
         )) goto LAB_0019979e;
    }
    pNVar4 = (local_88->rep_->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar14 = *(uint **)&pNVar4[uVar12].out.value_sequence_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
    local_78 = *(uint **)((long)&pNVar4[uVar12].out.value_sequence_.
                                 super__Vector_base<int,_std::allocator<int>_> + 8);
    if (puVar14 != local_78) goto LAB_001993a9;
  }
  goto LAB_0019979e;
  while( true ) {
    plVar8 = puVar9 + 2;
    if ((long *)*puVar9 == plVar8) {
      local_128 = *plVar8;
      uStack_120 = puVar9[3];
      local_138 = &local_128;
    }
    else {
      local_128 = *plVar8;
      local_138 = (long *)*puVar9;
    }
    local_130 = puVar9[1];
    *puVar9 = plVar8;
    puVar9[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
    plVar10 = plVar8 + 2;
    if ((long *)*plVar8 == plVar10) {
      local_b8 = *plVar10;
      lStack_b0 = plVar8[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar10;
      local_c8 = (long *)*plVar8;
    }
    local_c0 = plVar8[1];
    *plVar8 = (long)plVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c8);
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if (local_158 != local_148) {
      operator_delete(local_158,local_148[0] + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0],local_98[0] + 1);
    }
    puVar14 = local_70 + 1;
    uVar12 = local_d0;
    if (puVar14 == local_78) break;
LAB_001993a9:
    local_d0 = uVar12;
    uVar15 = 1;
    if (9 < local_d0) {
      uVar12 = local_d0;
      uVar2 = 4;
      do {
        uVar15 = uVar2;
        if (uVar12 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_00199409;
        }
        if (uVar12 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_00199409;
        }
        if (uVar12 < 10000) goto LAB_00199409;
        bVar5 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        uVar2 = uVar15 + 4;
      } while (bVar5);
      uVar15 = uVar15 + 1;
    }
LAB_00199409:
    uVar2 = *puVar14;
    local_a8[0] = local_98;
    local_70 = puVar14;
    std::__cxx11::string::_M_construct((ulong)local_a8,(char)uVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8[0],uVar15,local_d0);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x1ae160);
    local_118 = &local_108;
    plVar10 = plVar8 + 2;
    if ((long *)*plVar8 == plVar10) {
      local_108 = *plVar10;
      lStack_100 = plVar8[3];
    }
    else {
      local_108 = *plVar10;
      local_118 = (long *)*plVar8;
    }
    local_110 = plVar8[1];
    *plVar8 = (long)plVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
    puVar11 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar11) {
      local_e8 = *puVar11;
      lStack_e0 = plVar8[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar11;
      local_f8 = (ulong *)*plVar8;
    }
    local_f0 = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    uVar15 = -uVar2;
    if (0 < (int)uVar2) {
      uVar15 = uVar2;
    }
    __len = 1;
    if (9 < uVar15) {
      uVar12 = (ulong)uVar15;
      uVar6 = 4;
      do {
        __len = uVar6;
        uVar7 = (uint)uVar12;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_00199563;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_00199563;
        }
        if (uVar7 < 10000) goto LAB_00199563;
        uVar12 = uVar12 / 10000;
        uVar6 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_00199563:
    local_158 = local_148;
    std::__cxx11::string::_M_construct((ulong)&local_158,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_158),__len,uVar15);
    __return_storage_ptr__ = local_d8;
    uVar12 = 0xf;
    if (local_f8 != &local_e8) {
      uVar12 = local_e8;
    }
    if (uVar12 < (ulong)(local_150 + local_f0)) {
      uVar12 = 0xf;
      if (local_158 != local_148) {
        uVar12 = local_148[0];
      }
      if (uVar12 < (ulong)(local_150 + local_f0)) goto LAB_001995f5;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_001995f5:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_158);
    }
  }
LAB_0019979e:
  uVar12 = uVar12 + 1;
  if (uVar12 == local_80) goto LAB_001997af;
  goto LAB_00199318;
}

Assistant:

std::string GraphCycles::DebugString() const {
  std::unordered_set<int32_t> free_nodes_set(rep_->free_nodes_.begin(),
                                              rep_->free_nodes_.end());

  std::string result = "digraph {\n";
  for (int64_t i = 0, end = rep_->nodes_.size(); i < end; i++) {
    int32_t index = static_cast<int32_t>(i);
    if (!contains(free_nodes_set, index)) {
      continue;
    }

    for (int32_t succ : rep_->node_io_[i].out.GetSequence()) {
      result += "  \"" + std::to_string(i) + "\" -> \"" + std::to_string(succ) + "\"\n";
    }
  }

  result += "}\n";

  return result;
}